

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field_test.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::MapFieldBasePrimitiveTest_MutableRepeatedField_Test::
~MapFieldBasePrimitiveTest_MutableRepeatedField_Test
          (MapFieldBasePrimitiveTest_MutableRepeatedField_Test *this)

{
  (this->super_MapFieldBasePrimitiveTest).super_TestWithParam<bool>.super_Test._vptr_Test =
       (_func_int **)&PTR__MapFieldBasePrimitiveTest_0189d800;
  (this->super_MapFieldBasePrimitiveTest).super_TestWithParam<bool>.super_WithParamInterface<bool>.
  _vptr_WithParamInterface = (_func_int **)&PTR__MapFieldBasePrimitiveTest_0189d840;
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::destructor_impl((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                     *)&(this->super_MapFieldBasePrimitiveTest).initial_value_map_);
  (this->super_MapFieldBasePrimitiveTest).initial_value_map_.
  super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
  .
  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.capacity_ =
       0xffffffffffffff9d;
  ArenaHolder<google::protobuf::internal::MapField<proto2_unittest::TestMap_MapInt32Int32Entry_DoNotUse,_int,_int,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)5>_>
  ::~ArenaHolder(&(this->super_MapFieldBasePrimitiveTest).map_field_);
  std::unique_ptr<google::protobuf::Arena,_std::default_delete<google::protobuf::Arena>_>::
  ~unique_ptr(&(this->super_MapFieldBasePrimitiveTest).arena_);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x78);
  return;
}

Assistant:

TEST_P(MapFieldBasePrimitiveTest, MutableRepeatedField) {
  RepeatedPtrField<Message>* repeated =
      reinterpret_cast<RepeatedPtrField<Message>*>(
          map_field_base_->MutableRepeatedField());
  EXPECT_EQ(2, repeated->size());
  for (int i = 0; i < repeated->size(); i++) {
    const Message& message = repeated->Get(i);
    int key = message.GetReflection()->GetInt32(message, key_descriptor_);
    int value = message.GetReflection()->GetInt32(message, value_descriptor_);
    EXPECT_EQ(value, initial_value_map_[key]);
  }
}